

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_uint_32
png_get_PLTE(png_const_structrp png_ptr,png_inforp info_ptr,png_colorp *palette,int *num_palette)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (palette != (png_colorp *)0x0)) && ((info_ptr->valid & 8) != 0)) {
    *palette = info_ptr->palette;
    *num_palette = (uint)info_ptr->num_palette;
    pVar1 = 8;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_PLTE(png_const_structrp png_ptr, png_inforp info_ptr,
    png_colorp *palette, int *num_palette)
{
   png_debug1(1, "in %s retrieval function", "PLTE");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_PLTE) != 0 && palette != NULL)
   {
      *palette = info_ptr->palette;
      *num_palette = info_ptr->num_palette;
      png_debug1(3, "num_palette = %d", *num_palette);
      return (PNG_INFO_PLTE);
   }

   return (0);
}